

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pca.cpp
# Opt level: O0

Vector __thiscall PCA::tc(PCA *this,Vector *f,Matrix *eigen)

{
  Scalar *pSVar1;
  DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *in_RCX;
  Index extraout_RDX;
  Index IVar2;
  Index extraout_RDX_00;
  ReturnType RVar3;
  Vector VVar4;
  ColXpr local_68;
  uint local_30;
  undefined1 local_29;
  uint i;
  Matrix *eigen_local;
  Vector *f_local;
  PCA *this_local;
  Vector *res;
  
  local_29 = 0;
  _i = in_RCX;
  eigen_local = eigen;
  f_local = f;
  this_local = this;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,(uint *)f);
  IVar2 = extraout_RDX;
  for (local_30 = 0;
      local_30 <
      *(uint *)&(f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ; local_30 = local_30 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::col(&local_68,_i,(ulong)local_30);
    RVar3 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,-1,1,false>>::
            dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                      ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>> *)
                       &local_68,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)eigen_local)
    ;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,
                        (ulong)local_30);
    *pSVar1 = RVar3;
    IVar2 = extraout_RDX_00;
  }
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar2;
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector PCA::tc(Vector &f, Matrix &eigen) {
	Vector res = Vector(alpha);

	for(unsigned int i = 0; i < alpha; i++)
		res(i) = eigen.col(i).dot(f);

	return res;
}